

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

size_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy>::
encode_scan(jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this,
           unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>
           *process_line,byte_span destination)

{
  size_t sVar1;
  unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> *process_line_local;
  jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this_local;
  byte_span destination_local;
  
  std::unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>::operator=
            (&(this->super_encoder_strategy).process_line_,process_line);
  encoder_strategy::initialize(&this->super_encoder_strategy,destination);
  encode_lines(this);
  sVar1 = encoder_strategy::get_length(&this->super_encoder_strategy);
  return sVar1;
}

Assistant:

size_t encode_scan(std::unique_ptr<process_line> process_line, byte_span destination)
    {
        Strategy::process_line_ = std::move(process_line);

        Strategy::initialize(destination);
        encode_lines();

        return Strategy::get_length();
    }